

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O3

void FDDSTexture::CalcBitShift(DWORD mask,BYTE *lshiftp,BYTE *rshiftp)

{
  BYTE BVar1;
  
  if (mask == 0) {
    *rshiftp = '\0';
    *lshiftp = '\0';
    return;
  }
  if ((int)mask < 0) {
    BVar1 = '\0';
  }
  else {
    BVar1 = '\0';
    do {
      mask = mask * 2;
      BVar1 = BVar1 + '\x01';
    } while (-1 < (int)mask);
  }
  *lshiftp = BVar1;
  BVar1 = '\0';
  do {
    mask = mask * 2;
    BVar1 = BVar1 + '\x01';
  } while ((int)mask < 0);
  *rshiftp = BVar1;
  return;
}

Assistant:

void FDDSTexture::CalcBitShift (DWORD mask, BYTE *lshiftp, BYTE *rshiftp)
{
	BYTE shift;

	if (mask == 0)
	{
		*lshiftp = *rshiftp = 0;
		return;
	}

	shift = 0;
	while ((mask & 0x80000000) == 0)
	{
		mask <<= 1;
		shift++;
	}
	*lshiftp = shift;

	shift = 0;
	while (mask & 0x80000000)
	{
		mask <<= 1;
		shift++;
	}
	*rshiftp = shift;
}